

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O0

double S2::Area(S2Point *a,S2Point *b,S2Point *c)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_d0;
  double local_c8;
  double local_c0;
  double area;
  double dmin;
  double s2;
  double s;
  double sc;
  double sb;
  double sa;
  S2LogMessage local_80;
  S2LogMessageVoidify local_6a;
  byte local_69;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  S2Point *local_28;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_28 = c;
  c_local = b;
  b_local = a;
  bVar1 = IsUnitLength(a);
  local_41 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
               ,0x39,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,"Check failed: IsUnitLength(a) ");
    S2LogMessageVoidify::operator&(&local_29,poVar2);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  bVar1 = IsUnitLength(c_local);
  local_69 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
               ,0x3a,kFatal,(ostream *)&std::cerr);
    local_69 = 1;
    poVar2 = S2LogMessage::stream(&local_68);
    poVar2 = std::operator<<(poVar2,"Check failed: IsUnitLength(b) ");
    S2LogMessageVoidify::operator&(local_55,poVar2);
  }
  if ((local_69 & 1) == 0) {
    bVar1 = IsUnitLength(local_28);
    sa._7_1_ = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2measures.cc"
                 ,0x3b,kFatal,(ostream *)&std::cerr);
      sa._7_1_ = 1;
      poVar2 = S2LogMessage::stream(&local_80);
      poVar2 = std::operator<<(poVar2,"Check failed: IsUnitLength(c) ");
      S2LogMessageVoidify::operator&(&local_6a,poVar2);
    }
    if ((sa._7_1_ & 1) == 0) {
      sb = Vector3<double>::Angle(c_local,local_28);
      sc = Vector3<double>::Angle(local_28,b_local);
      s = Vector3<double>::Angle(b_local,c_local);
      dVar4 = (sb + sc + s) * 0.5;
      s2 = dVar4;
      if (0.0003 <= dVar4) {
        dmin = dVar4 * dVar4;
        pdVar3 = std::max<double>(&sc,&s);
        pdVar3 = std::max<double>(&sb,pdVar3);
        area = dVar4 - *pdVar3;
        if ((area < s2 * 0.01 * dmin * dmin) &&
           (local_c0 = GirardArea(b_local,c_local,local_28), area < s2 * (local_c0 + 5e-15) * 0.1))
        {
          return local_c0;
        }
      }
      local_c8 = 0.0;
      dVar4 = tan(s2 * 0.5);
      dVar5 = tan((s2 - sb) * 0.5);
      dVar6 = tan((s2 - sc) * 0.5);
      local_d0 = tan((s2 - s) * 0.5);
      local_d0 = dVar4 * dVar5 * dVar6 * local_d0;
      pdVar3 = std::max<double>(&local_c8,&local_d0);
      dVar4 = sqrt(*pdVar3);
      dVar4 = atan(dVar4);
      return dVar4 * 4.0;
    }
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
}

Assistant:

double Area(const S2Point& a, const S2Point& b, const S2Point& c) {
  S2_DCHECK(IsUnitLength(a));
  S2_DCHECK(IsUnitLength(b));
  S2_DCHECK(IsUnitLength(c));
  // This method is based on l'Huilier's theorem,
  //
  //   tan(E/4) = sqrt(tan(s/2) tan((s-a)/2) tan((s-b)/2) tan((s-c)/2))
  //
  // where E is the spherical excess of the triangle (i.e. its area),
  //       a, b, c, are the side lengths, and
  //       s is the semiperimeter (a + b + c) / 2 .
  //
  // The only significant source of error using l'Huilier's method is the
  // cancellation error of the terms (s-a), (s-b), (s-c).  This leads to a
  // *relative* error of about 1e-16 * s / min(s-a, s-b, s-c).  This compares
  // to a relative error of about 1e-15 / E using Girard's formula, where E is
  // the true area of the triangle.  Girard's formula can be even worse than
  // this for very small triangles, e.g. a triangle with a true area of 1e-30
  // might evaluate to 1e-5.
  //
  // So, we prefer l'Huilier's formula unless dmin < s * (0.1 * E), where
  // dmin = min(s-a, s-b, s-c).  This basically includes all triangles
  // except for extremely long and skinny ones.
  //
  // Since we don't know E, we would like a conservative upper bound on
  // the triangle area in terms of s and dmin.  It's possible to show that
  // E <= k1 * s * sqrt(s * dmin), where k1 = 2*sqrt(3)/Pi (about 1).
  // Using this, it's easy to show that we should always use l'Huilier's
  // method if dmin >= k2 * s^5, where k2 is about 1e-2.  Furthermore,
  // if dmin < k2 * s^5, the triangle area is at most k3 * s^4, where
  // k3 is about 0.1.  Since the best case error using Girard's formula
  // is about 1e-15, this means that we shouldn't even consider it unless
  // s >= 3e-4 or so.
  //
  // TODO(ericv): Implement rigorous error bounds (analysis already done).
  double sa = b.Angle(c);
  double sb = c.Angle(a);
  double sc = a.Angle(b);
  double s = 0.5 * (sa + sb + sc);
  if (s >= 3e-4) {
    // Consider whether Girard's formula might be more accurate.
    double s2 = s * s;
    double dmin = s - max(sa, max(sb, sc));
    if (dmin < 1e-2 * s * s2 * s2) {
      // This triangle is skinny enough to consider using Girard's formula.
      // We increase the area by the approximate maximum error in the Girard
      // calculation in order to ensure that this test is conservative.
      double area = GirardArea(a, b, c);
      if (dmin < s * (0.1 * (area + 5e-15))) return area;
    }
  }
  // Use l'Huilier's formula.
  return 4 * atan(sqrt(max(0.0, tan(0.5 * s) * tan(0.5 * (s - sa)) *
                           tan(0.5 * (s - sb)) * tan(0.5 * (s - sc)))));
}